

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_3_2::anon_unknown_30::saveLevel(DeepTiledOutputFile *out,DeepImage *img,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  DeepImageChannel *pDVar5;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RSI;
  int iVar6;
  DeepFrameBuffer *in_RDI;
  ConstIterator i;
  DeepFrameBuffer fb;
  DeepImageLevel *level;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  ConstIterator *in_stack_fffffffffffffea0;
  DeepFrameBuffer *in_stack_fffffffffffffec0;
  SampleCountChannel *in_stack_fffffffffffffee0;
  undefined1 local_118 [56];
  const_iterator local_e0;
  const_iterator local_d8;
  Slice local_88 [104];
  DeepImageLevel *local_20;
  int local_14;
  DeepFrameBuffer *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_20 = (DeepImageLevel *)(**(code **)(*in_RSI + 0x30))(in_RSI,in_EDX,in_ECX);
  DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffec0);
  DeepImageLevel::sampleCounts(local_20);
  SampleCountChannel::slice(in_stack_fffffffffffffee0);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_88);
  local_d8._M_node =
       (_Base_ptr)
       DeepImageLevel::begin
                 ((DeepImageLevel *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  while( true ) {
    local_e0._M_node =
         (_Base_ptr)
         DeepImageLevel::end((DeepImageLevel *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar1 = operator!=(in_stack_fffffffffffffea0,
                       (ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (!bVar1) break;
    psVar4 = DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x126e9b);
    pDVar5 = DeepImageLevel::ConstIterator::channel((ConstIterator *)0x126eaa);
    (*(pDVar5->super_ImageChannel)._vptr_ImageChannel[4])(local_118);
    Imf_3_2::DeepFrameBuffer::insert((string *)local_88,(DeepSlice *)psVar4);
    DeepImageLevel::ConstIterator::operator++(in_stack_fffffffffffffea0);
  }
  Imf_3_2::DeepTiledOutputFile::setFrameBuffer(local_8);
  iVar6 = (int)local_8;
  local_8._0_4_ = iVar6;
  iVar2 = Imf_3_2::DeepTiledOutputFile::numXTiles(iVar6);
  iVar3 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)local_8);
  Imf_3_2::DeepTiledOutputFile::writeTiles(iVar6,0,iVar2 + -1,0,iVar3 + -1,local_14);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x126fa7);
  return;
}

Assistant:

void
saveLevel (DeepTiledOutputFile& out, const DeepImage& img, int x, int y)
{
    const DeepImageLevel& level = img.level (x, y);
    DeepFrameBuffer       fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    out.setFrameBuffer (fb);
    out.writeTiles (0, out.numXTiles (x) - 1, 0, out.numYTiles (y) - 1, x, y);
}